

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32Interface.cpp
# Opt level: O0

int connectssc32interface(RS232PORT *pSSC32InterfacePseudoRS232Port)

{
  int iVar1;
  RS232PORT *pSSC32InterfacePseudoRS232Port_local;
  
  iVar1 = OpenRS232Port(pSSC32InterfacePseudoRS232Port,szSSC32InterfacePath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(pSSC32InterfacePseudoRS232Port,SSC32InterfaceBaudRate,'\0',0,'\b',
                                '\0',SSC32InterfaceTimeout);
    if (iVar1 == 0) {
      printf("SSC32Interface connected.\n");
      pSSC32InterfacePseudoRS232Port_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a SSC32Interface.\n");
      CloseRS232Port(pSSC32InterfacePseudoRS232Port);
      pSSC32InterfacePseudoRS232Port_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a SSC32Interface.\n");
    pSSC32InterfacePseudoRS232Port_local._4_4_ = 1;
  }
  return pSSC32InterfacePseudoRS232Port_local._4_4_;
}

Assistant:

int connectssc32interface(RS232PORT* pSSC32InterfacePseudoRS232Port)
{
	if (OpenRS232Port(pSSC32InterfacePseudoRS232Port, szSSC32InterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a SSC32Interface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pSSC32InterfacePseudoRS232Port, SSC32InterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)SSC32InterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SSC32Interface.\n");
		CloseRS232Port(pSSC32InterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("SSC32Interface connected.\n");

	return EXIT_SUCCESS;
}